

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

Value<char> * __thiscall Qentem::Value<char>::operator=(Value<char> *this,Value<char> *val)

{
  ValueType type_00;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> *pHVar1;
  Array<Qentem::Value<char>_> *src;
  String<char> *src_00;
  ValueType type;
  Value<char> *val_local;
  Value<char> *this_local;
  
  if (this != val) {
    type_00 = Type(val);
    setTypeToUndefined(val);
    reset(this);
    setType(this,type_00);
    if (type_00 == Object) {
      pHVar1 = Memory::Move<Qentem::HArray<Qentem::String<char>,Qentem::Value<char>>>
                         ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)val);
      HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator=
                ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)this,pHVar1);
    }
    else if (type_00 == Array) {
      src = Memory::Move<Qentem::Array<Qentem::Value<char>>>((Array<Qentem::Value<char>_> *)val);
      Array<Qentem::Value<char>_>::operator=((Array<Qentem::Value<char>_> *)this,src);
    }
    else if (type_00 == String) {
      src_00 = Memory::Move<Qentem::String<char>>((String<char> *)val);
      String<char>::operator=((String<char> *)this,src_00);
    }
    else {
      (this->field_0).array_.storage_ = (val->field_0).array_.storage_;
    }
  }
  return this;
}

Assistant:

Value &operator=(Value &&val) noexcept {
        if (this != &val) {
            const ValueType type = val.Type();

            val.setTypeToUndefined();

            reset();
            setType(type);

            switch (type) {
                case ValueType::Object: {
                    object_ = Memory::Move(val.object_);
                    break;
                }

                case ValueType::Array: {
                    array_ = Memory::Move(val.array_);
                    break;
                }

                case ValueType::String: {
                    string_ = Memory::Move(val.string_);
                    break;
                }

                default: {
                    number_ = val.number_;
                }
            }
        }

        return *this;
    }